

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFacePtr __thiscall ON_SubDEdge::FacePtrFromFace(ON_SubDEdge *this,ON_SubDFace *f)

{
  ushort uVar1;
  ON_SubDFace *pOVar2;
  uint local_30;
  uint efi;
  uint edge_face_count;
  ON_SubDFacePtr *fptr;
  ON_SubDFace *f_local;
  ON_SubDEdge *this_local;
  
  if (f != (ON_SubDFace *)0x0) {
    _efi = this->m_face2;
    uVar1 = this->m_face_count;
    local_30 = 0;
    while ((local_30 < uVar1 &&
           ((local_30 != 2 || (_efi = this->m_facex, _efi != (ON_SubDFacePtr *)0x0))))) {
      pOVar2 = ON_SubDFacePtr::Face(_efi);
      if (pOVar2 == f) {
        return (ON_SubDFacePtr)_efi->m_ptr;
      }
      local_30 = local_30 + 1;
      _efi = _efi + 1;
    }
  }
  return (ON_SubDFacePtr)0;
}

Assistant:

const ON_SubDFacePtr ON_SubDEdge::FacePtrFromFace(
  const class ON_SubDFace* f
) const
{
  if (nullptr != f)
  {
    const ON_SubDFacePtr* fptr = m_face2;
    const unsigned int edge_face_count = m_face_count;
    for (unsigned int efi = 0; efi < edge_face_count; efi++, fptr++)
    {
      if (2 == efi)
      {
        fptr = m_facex;
        if (nullptr == fptr)
          break;
      }
      if (fptr->Face() == f)
        return *fptr;
    }
  }
  return ON_SubDFacePtr::Null;
}